

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2d29a37::MemPoolAccept::CheckFeeRate
          (MemPoolAccept *this,size_t package_size,CAmount package_fee,TxValidationState *state)

{
  bool bVar1;
  CAmount CVar2;
  long *in_R8;
  uint32_t num_bytes;
  long in_FS_OFFSET;
  CAmount local_90;
  allocator<char> local_81;
  CAmount mempoolRejectFee;
  CAmount package_fee_local;
  string local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  package_fee_local = package_fee;
  local_50._M_dataplus._M_p = (pointer)CTxMemPool::GetMinFee(this->m_pool);
  num_bytes = (uint32_t)package_size;
  mempoolRejectFee = CFeeRate::GetFee((CFeeRate *)&local_50,num_bytes);
  if (package_fee < mempoolRejectFee && 0 < mempoolRejectFee) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"mempool min fee not met",(allocator<char> *)&local_90);
    tinyformat::format<long,long>
              (&local_70,(tinyformat *)0xe28124,(char *)&package_fee_local,&mempoolRejectFee,in_R8);
    bVar1 = ValidationState<TxValidationResult>::Invalid
                      (&state->super_ValidationState<TxValidationResult>,TX_RECONSIDERABLE,&local_50
                       ,&local_70);
  }
  else {
    CVar2 = CFeeRate::GetFee(&(this->m_pool->m_opts).min_relay_feerate,num_bytes);
    bVar1 = true;
    if (CVar2 <= package_fee) goto LAB_008d318b;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"min relay fee not met",&local_81);
    local_90 = CFeeRate::GetFee(&(this->m_pool->m_opts).min_relay_feerate,num_bytes);
    tinyformat::format<long,long>
              (&local_70,(tinyformat *)0xe28124,(char *)&package_fee_local,&local_90,in_R8);
    bVar1 = ValidationState<TxValidationResult>::Invalid
                      (&state->super_ValidationState<TxValidationResult>,TX_RECONSIDERABLE,&local_50
                       ,&local_70);
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
LAB_008d318b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main, m_pool.cs)
    {
        AssertLockHeld(::cs_main);
        AssertLockHeld(m_pool.cs);
        CAmount mempoolRejectFee = m_pool.GetMinFee().GetFee(package_size);
        if (mempoolRejectFee > 0 && package_fee < mempoolRejectFee) {
            return state.Invalid(TxValidationResult::TX_RECONSIDERABLE, "mempool min fee not met", strprintf("%d < %d", package_fee, mempoolRejectFee));
        }

        if (package_fee < m_pool.m_opts.min_relay_feerate.GetFee(package_size)) {
            return state.Invalid(TxValidationResult::TX_RECONSIDERABLE, "min relay fee not met",
                                 strprintf("%d < %d", package_fee, m_pool.m_opts.min_relay_feerate.GetFee(package_size)));
        }
        return true;
    }